

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeDriverGetProperties(ze_driver_handle_t hDriver,ze_driver_properties_t *pDriverProperties)

{
  ze_pfnDriverGetProperties_t pfnGetProperties;
  ze_result_t result;
  ze_driver_properties_t *pDriverProperties_local;
  ze_driver_handle_t hDriver_local;
  
  pfnGetProperties._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c1e0 != (code *)0x0) {
    pfnGetProperties._4_4_ = (*DAT_0011c1e0)(hDriver,pDriverProperties);
  }
  return pfnGetProperties._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeDriverGetProperties(
        ze_driver_handle_t hDriver,                     ///< [in] handle of the driver instance
        ze_driver_properties_t* pDriverProperties       ///< [in,out] query result for driver properties
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetProperties = context.zeDdiTable.Driver.pfnGetProperties;
        if( nullptr != pfnGetProperties )
        {
            result = pfnGetProperties( hDriver, pDriverProperties );
        }
        else
        {
            // generic implementation
        }

        return result;
    }